

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

cni_holder_base *
cs_impl::cni::construct_helper<cs_impl::any(*)(std::__cxx11::string_const&,std::_Ios_Openmode)>::
_construct<cs_impl::any(&)(std::__cxx11::string_const&,std::_Ios_Openmode),cs_impl::any,std::__cxx11::string_const&,std::_Ios_Openmode>
          (_func_any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr__Ios_Openmode
           *val,_func_any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr__Ios_Openmode
                *target_function)

{
  cni_holder_base *pcVar1;
  _func_any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr__Ios_Openmode
  **in_stack_00000008;
  cni_holder<cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  *in_stack_00000010;
  _func_any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr__Ios_Openmode
  *in_stack_ffffffffffffffc8;
  _func_any_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr__Ios_Openmode
  *in_stack_ffffffffffffffd0;
  
  check_conversion<cs_impl::any,cs_impl::any,std::__cxx11::string_const&,std::_Ios_Openmode,std::__cxx11::string_const&,std::_Ios_Openmode>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pcVar1 = (cni_holder_base *)operator_new(0x28);
  cni_holder<cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode),_cs_impl::any_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::_Ios_Openmode)>
  ::cni_holder(in_stack_00000010,in_stack_00000008);
  return pcVar1;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}